

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.hpp
# Opt level: O3

void __thiscall elf_parser::Elf_parser::~Elf_parser(Elf_parser *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->_last_error)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_last_error).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_program_path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_program_path).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Elf_parser (const std::string &program_path): 
		m_program_path{program_path},
		_failed(false)
	{   
            load_memory_map();
        }